

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-server.c
# Opt level: O0

void readcb(bufferevent *bev,void *ptr)

{
  int iVar1;
  http2_session_data *session_data;
  
  iVar1 = session_recv((http2_session_data *)ptr);
  if (iVar1 != 0) {
    delete_http2_session_data(session_data);
  }
  return;
}

Assistant:

static void readcb(struct bufferevent *bev, void *ptr) {
  http2_session_data *session_data = (http2_session_data *)ptr;
  (void)bev;

  if (session_recv(session_data) != 0) {
    delete_http2_session_data(session_data);
    return;
  }
}